

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
          (SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *this,int *key,VmConstant **value)

{
  Node *pNVar1;
  uint uVar2;
  int iVar3;
  Node *pNVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<int, VmConstant *, IntHasher, 8>::insert(const Key &, const Value &) [Key = int, Value = VmConstant *, Hasher = IntHasher, N = 8]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar2 = this->bucketCount;
  if (uVar2 != 0) {
    uVar5 = *key * -0x61c8864f & uVar2 - 1;
    pNVar4 = this->data;
    uVar6 = 1;
    do {
      pNVar1 = pNVar4 + uVar5;
      iVar3 = pNVar4[uVar5].key;
      if (iVar3 == 0) {
        pNVar1->key = *key;
        pNVar1->value = *value;
        this->count = this->count + 1;
LAB_001aca74:
        bVar7 = false;
      }
      else {
        if (iVar3 == *key) {
          pNVar1->value = *value;
          goto LAB_001aca74;
        }
        uVar5 = uVar5 + uVar6 & uVar2 - 1;
        bVar7 = true;
      }
      if (!bVar7) {
        return;
      }
      bVar7 = uVar6 != uVar2;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<int, VmConstant *, IntHasher, 8>::insert(const Key &, const Value &) [Key = int, Value = VmConstant *, Hasher = IntHasher, N = 8]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}